

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O2

void la_miam_xoff_ind_format_json(la_vstring *vstr,void *data)

{
  la_json_append_bool(vstr,"all_files",*data == 0xfff);
  if ((ulong)*data == 0xfff) {
    return;
  }
  la_json_append_int64(vstr,"file_id",(ulong)*data);
  return;
}

Assistant:

static void la_miam_xoff_ind_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_xoff_ind_msg const *msg = data;
	la_json_append_bool(vstr, "all_files", msg->file_id == 0xFFF);
	if(msg->file_id != 0xFFF) {
		la_json_append_int64(vstr, "file_id", msg->file_id);
	}
}